

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

int integerlength(uint n)

{
  int iVar1;
  
  if (n < 3) {
    return n;
  }
  iVar1 = 1;
  do {
    iVar1 = iVar1 + 1;
    n = n >> 1;
  } while (n != 1);
  return iVar1;
}

Assistant:

int integerlength(unsigned int n) {
  int cnt;
  if (n <= 2)
    return (n);
  else {
    cnt = 1;
    do {
      cnt++;
      n = (n >> 1);
    } while (n != 1);
    return (cnt);
  }
}